

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void checkList(IntegrityCk *pCheck,int isFreeList,Pgno iPage,u32 N)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint *puVar4;
  int iVar5;
  BtShared *pBVar6;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  DbPage *pOvflPage;
  DbPage *local_48;
  ulong local_40;
  ulong local_38;
  
  iVar3 = pCheck->nErr;
  uVar12 = (ulong)N;
  if (iPage != 0) {
    uVar12 = (ulong)N;
    do {
      if (pCheck->mxErr == 0) break;
      iVar5 = checkRef(pCheck,iPage);
      uVar10 = (uint)uVar12;
      if (iVar5 != 0) {
LAB_0016b4e6:
        uVar12 = (ulong)uVar10;
        break;
      }
      uVar10 = uVar10 - 1;
      iVar5 = (*pCheck->pPager->xGet)(pCheck->pPager,iPage,&local_48,0);
      if (iVar5 != 0) {
        checkAppendMsg(pCheck,"failed to get page %d",(ulong)iPage);
        goto LAB_0016b4e6;
      }
      puVar4 = (uint *)local_48->pData;
      if (isFreeList == 0) {
        if ((pCheck->pBt->autoVacuum != '\0') && (uVar10 != 0)) {
          uVar9 = *puVar4;
          checkPtrmap(pCheck,uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                             uVar9 << 0x18,'\x04',iPage);
        }
      }
      else {
        uVar9 = puVar4[1];
        uVar7 = (uint)*(byte *)((long)puVar4 + 5);
        bVar1 = *(byte *)((long)puVar4 + 6);
        bVar2 = *(byte *)((long)puVar4 + 7);
        pBVar6 = pCheck->pBt;
        local_38 = uVar12;
        if (pBVar6->autoVacuum != '\0') {
          local_40 = (ulong)*(byte *)((long)puVar4 + 5);
          checkPtrmap(pCheck,iPage,'\x02',0);
          uVar7 = (uint)local_40;
          pBVar6 = pCheck->pBt;
        }
        iVar5 = (uint)(byte)uVar9 * 0x1000000;
        uVar11 = (uint)bVar1 * 0x100;
        uVar9 = uVar7 * 0x10000 + iVar5 | uVar11 | (uint)bVar2;
        if ((pBVar6->usableSize >> 2) - 2 < uVar9) {
          checkAppendMsg(pCheck,"freelist leaf count too big on page %d",(ulong)iPage);
          uVar10 = (int)local_38 - 2;
        }
        else {
          if (0 < (int)uVar9) {
            uVar12 = 0;
            do {
              uVar13 = puVar4[uVar12 + 2];
              uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                       uVar13 << 0x18;
              if (pCheck->pBt->autoVacuum != '\0') {
                checkPtrmap(pCheck,uVar13,'\x02',0);
              }
              checkRef(pCheck,uVar13);
              uVar12 = uVar12 + 1;
            } while (uVar11 + bVar2 + iVar5 + uVar7 * 0x10000 != uVar12);
          }
          uVar10 = uVar10 - uVar9;
        }
      }
      uVar12 = (ulong)uVar10;
      uVar10 = *puVar4;
      if (local_48 != (DbPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_48);
      }
      iPage = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
    } while (iPage != 0);
  }
  if (((int)uVar12 != 0) && (iVar3 == pCheck->nErr)) {
    pcVar8 = "size";
    if (isFreeList == 0) {
      pcVar8 = "overflow list length";
    }
    checkAppendMsg(pCheck,"%s is %d but should be %d",pcVar8,(ulong)(N - (int)uVar12));
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  Pgno iPage,           /* Page number for first page in the list */
  u32 N                 /* Expected number of pages in the list */
){
  int i;
  u32 expected = N;
  int nErrAtStart = pCheck->nErr;
  while( iPage!=0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( checkRef(pCheck, iPage) ) break;
    N--;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage, 0) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      u32 n = (u32)get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<(int)n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
  if( N && nErrAtStart==pCheck->nErr ){
    checkAppendMsg(pCheck,
      "%s is %d but should be %d",
      isFreeList ? "size" : "overflow list length",
      expected-N, expected);
  }
}